

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::WriteDouble(Builder *this,double f,uint8_t byte_width)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,byte_width);
  if (iVar1 == 4) {
    Write<float>(this,(float)f,4);
    return;
  }
  if (iVar1 == 8) {
    Write<double>(this,f,8);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5ae,"void flexbuffers::Builder::WriteDouble(double, uint8_t)");
}

Assistant:

void WriteDouble(double f, uint8_t byte_width) {
    switch (byte_width) {
      case 8: Write(f, byte_width); break;
      case 4: Write(static_cast<float>(f), byte_width); break;
      // case 2: Write(static_cast<half>(f), byte_width); break;
      // case 1: Write(static_cast<quarter>(f), byte_width); break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }